

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockAgentTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::testutils::MockAgent_testSamplingManager_Test::TestBody
          (MockAgent_testSamplingManager_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  RateLimitingSamplingStrategy rateLimiting;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b0;
  __string_type uriStr_3;
  input_adapter local_488;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_478;
  shared_ptr<jaegertracing::testutils::MockAgent> mockAgent;
  AssertionResult gtest_ar;
  __string_type uriStr;
  Response response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  __string_type uriStr_2;
  URI uri;
  _Any_data local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  _Any_data local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ostringstream oss;
  
  MockAgent::make();
  jaegertracing::testutils::MockAgent::start();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"http://");
  memcpy((IPAddress *)&uri,
         mockAgent.
         super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         + 0x240,0x88);
  net::IPAddress::authority_abi_cxx11_((string *)&response,(IPAddress *)&uri);
  poVar2 = std::operator<<(poVar2,(string *)&response);
  std::operator<<(poVar2,'/');
  std::__cxx11::string::~string((string *)&response);
  std::__cxx11::stringbuf::str();
  jaegertracing::net::URI::parse((string *)&uri);
  jaegertracing::net::http::get((URI *)&response);
  testing::internal::CmpHelperEQ<char[23],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"no \'service\' parameter\"","response.body()",
             (char (*) [23])"no \'service\' parameter",&local_308);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&uriStr_2);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&uriStr_3,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
               ,0x53,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&uriStr_3,(Message *)&uriStr_2);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    net::http::Response::~Response(&response);
    net::URI::~URI(&uri);
    std::__cxx11::string::~string((string *)&uriStr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"http://");
    memcpy((IPAddress *)&uri,
           mockAgent.
           super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 0x240,0x88);
    net::IPAddress::authority_abi_cxx11_((string *)&response,(IPAddress *)&uri);
    poVar2 = std::operator<<(poVar2,(string *)&response);
    std::operator<<(poVar2,"/?service=a&service=b");
    std::__cxx11::string::~string((string *)&response);
    std::__cxx11::stringbuf::str();
    jaegertracing::net::URI::parse((string *)&uri);
    jaegertracing::net::http::get((URI *)&response);
    testing::internal::CmpHelperEQ<char[41],std::__cxx11::string>
              ((internal *)&gtest_ar,"\"\'service\' parameter must occur only once\"",
               "response.body()",(char (*) [41])"\'service\' parameter must occur only once",
               &local_308);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      net::http::Response::~Response(&response);
      net::URI::~URI(&uri);
      std::__cxx11::string::~string((string *)&uriStr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"http://");
      memcpy((IPAddress *)&uri,
             mockAgent.
             super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr + 0x240,0x88);
      net::IPAddress::authority_abi_cxx11_((string *)&response,(IPAddress *)&uri);
      poVar2 = std::operator<<(poVar2,(string *)&response);
      std::operator<<(poVar2,"/?service=something");
      std::__cxx11::string::~string((string *)&response);
      std::__cxx11::stringbuf::str();
      jaegertracing::net::URI::parse((string *)&uri);
      jaegertracing::net::http::get((URI *)&response);
      uriStr._M_dataplus._M_p = &thrift::Batch::vtable;
      uriStr._M_string_length._0_4_ = 0;
      uriStr.field_2._M_allocated_capacity = (size_type)std::runtime_error::runtime_error;
      uriStr.field_2._8_8_ = 0;
      nlohmann::detail::input_adapter::
      input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((input_adapter *)&rateLimiting,&local_308);
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1c8._M_unused._M_object = (void *)0x0;
      local_1c8._8_8_ = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)&uriStr_3,(input_adapter *)&rateLimiting,(parser_callback_t *)&local_1c8,true);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&gtest_ar);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::operator=
                ((SamplingStrategyResponse *)&uriStr,(SamplingStrategyResponse *)&gtest_ar);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                ((SamplingStrategyResponse *)&gtest_ar);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&uriStr_3);
      std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4b0);
      uriStr_3._M_dataplus._M_p._0_4_ = 0;
      testing::internal::
      CmpHelperEQ<jaegertracing::sampling_manager::thrift::SamplingStrategyType::type,jaegertracing::sampling_manager::thrift::SamplingStrategyType::type>
                ((internal *)&gtest_ar,
                 "sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC",
                 "response.strategyType",(type *)&uriStr_3,(type *)&uriStr._M_string_length);
      bVar1 = gtest_ar.success_;
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&uriStr_3);
        if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
            (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&rateLimiting,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
                   ,0x68,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&rateLimiting,(Message *)&uriStr_3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&rateLimiting);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&uriStr_3);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                ((SamplingStrategyResponse *)&uriStr);
      net::http::Response::~Response(&response);
      net::URI::~URI(&uri);
      std::__cxx11::string::~string((string *)&uriStr_2);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      if (bVar1 != false) {
        uriStr._M_dataplus._M_p = &thrift::Batch::vtable;
        uriStr._M_string_length._0_4_ = 0;
        uriStr.field_2._M_allocated_capacity = (size_type)std::runtime_error::runtime_error;
        uriStr.field_2._8_8_ = 0;
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_strategyType
                  ((type)&uriStr);
        _rateLimiting = std::exception::~exception;
        local_4b0._M_pi._0_2_ = 0;
        jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy::
        __set_maxTracesPerSecond((short)&rateLimiting);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::
        __set_rateLimitingSampling((RateLimitingSamplingStrategy *)&uriStr);
        MockAgent::
        addSamplingStrategy<char_const(&)[11],jaegertracing::sampling_manager::thrift::SamplingStrategyResponse&>
                  (mockAgent.
                   super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(char (*) [11])0x1ee070,(SamplingStrategyResponse *)&uriStr);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"http://");
        memcpy((IPAddress *)&uri,
               mockAgent.
               super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr + 0x240,0x88);
        net::IPAddress::authority_abi_cxx11_((string *)&response,(IPAddress *)&uri);
        poVar2 = std::operator<<(poVar2,(string *)&response);
        std::operator<<(poVar2,"/?service=service123");
        std::__cxx11::string::~string((string *)&response);
        std::__cxx11::stringbuf::str();
        jaegertracing::net::URI::parse((string *)&uri);
        jaegertracing::net::http::get((URI *)&response);
        gtest_ar._0_8_ = &thrift::Batch::vtable;
        gtest_ar.message_.ptr_._0_4_ = 0;
        nlohmann::detail::input_adapter::
        input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_488,&local_308);
        local_1d8 = 0;
        uStack_1d0 = 0;
        local_1e8._M_unused._M_object = (void *)0x0;
        local_1e8._8_8_ = 0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::parse(&local_478,&local_488,(parser_callback_t *)&local_1e8,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&uriStr_2);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::operator=
                  ((SamplingStrategyResponse *)&gtest_ar,(SamplingStrategyResponse *)&uriStr_2);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                  ((SamplingStrategyResponse *)&uriStr_2);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_478);
        std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_488.ia.
                    super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        testing::internal::
        CmpHelperEQ<jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,jaegertracing::sampling_manager::thrift::SamplingStrategyResponse>
                  ((internal *)&uriStr_2,"config","response",(SamplingStrategyResponse *)&uriStr,
                   (SamplingStrategyResponse *)&gtest_ar);
        if ((char)uriStr_2._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_478);
          if (uriStr_2._M_string_length == 0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)uriStr_2._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_488,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
                     ,0x7b,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_488,(Message *)&local_478);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_488);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_478);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&uriStr_2._M_string_length);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                  ((SamplingStrategyResponse *)&gtest_ar);
        net::http::Response::~Response(&response);
        net::URI::~URI(&uri);
        std::__cxx11::string::~string((string *)&uriStr_3);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
        jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy::
        ~RateLimitingSamplingStrategy(&rateLimiting);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                  ((SamplingStrategyResponse *)&uriStr);
      }
      goto LAB_001d42da;
    }
    testing::Message::Message((Message *)&uriStr_2);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&uriStr_3,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&uriStr_3,(Message *)&uriStr_2);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&uriStr_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&uriStr_2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  net::http::Response::~Response(&response);
  net::URI::~URI(&uri);
  std::__cxx11::string::~string((string *)&uriStr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
LAB_001d42da:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mockAgent.
              super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(MockAgent, testSamplingManager)
{
    auto mockAgent = MockAgent::make();
    mockAgent->start();

    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << '/';
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto response = net::http::get(uri);
        ASSERT_EQ("no 'service' parameter", response.body());
    }
    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=a&service=b";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto response = net::http::get(uri);
        ASSERT_EQ("'service' parameter must occur only once", response.body());
    }
    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=something";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto responseHTTP = net::http::get(uri);
        sampling_manager::thrift::SamplingStrategyResponse response;
        response = nlohmann::json::parse(responseHTTP.body());
        ASSERT_EQ(sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC,
                  response.strategyType);
    }
    {
        sampling_manager::thrift::SamplingStrategyResponse config;
        config.__set_strategyType(
            sampling_manager::thrift::SamplingStrategyType::RATE_LIMITING);
        sampling_manager::thrift::RateLimitingSamplingStrategy rateLimiting;
        rateLimiting.__set_maxTracesPerSecond(123);
        config.__set_rateLimitingSampling(rateLimiting);
        mockAgent->addSamplingStrategy("service123", config);

        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=service123";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto responseHTTP = net::http::get(uri);
        sampling_manager::thrift::SamplingStrategyResponse response;
        response = nlohmann::json::parse(responseHTTP.body());
        ASSERT_EQ(config, response);
    }
}